

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool findKeyPresses<short>
               (TWaveformViewT<short> *waveform,TKeyPressCollectionT<short> *res,
               TWaveformT<short> *waveformThreshold,TWaveformT<short> *waveformMax,
               double thresholdBackground,int historySize,int historySizeReset,bool removeLowPower)

{
  pointer *ppsVar1;
  short sVar2;
  short *psVar3;
  size_type __n;
  iterator iVar4;
  pointer psVar5;
  long lVar6;
  pointer psVar7;
  TKeyPressPosition TVar8;
  TValueCC TVar9;
  int64_t iVar10;
  TKey TVar11;
  TKey TVar12;
  undefined4 uVar13;
  size_type sVar14;
  long lVar15;
  _Elt_pointer plVar16;
  pointer psVar17;
  TKeyPressCollectionT<short> *__range3;
  iterator __end0;
  short sVar18;
  ulong uVar19;
  pointer psVar20;
  stKeyPressData<short> *kp_1;
  size_type __n_00;
  pointer psVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  stKeyPressData<short> *psVar25;
  pointer psVar26;
  int iVar27;
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  TKeyPressCollectionT<short> res2;
  TWaveformT<short> waveformAbs;
  vector<double,_std::allocator<double>_> rbSamples;
  long local_138;
  double local_130;
  stKeyPressData<short> local_128;
  vector<short,_std::allocator<short>_> local_f0;
  _Deque_base<long,_std::allocator<long>_> local_d8;
  vector<short,_std::allocator<short>_> *local_88;
  int local_7c;
  TWaveformT<short> *local_78;
  double local_70;
  long local_68;
  vector<double,_std::allocator<double>_> local_60;
  TWaveformViewT<short> *local_48;
  long local_40;
  long local_38;
  undefined1 auVar28 [16];
  
  psVar26 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_finish != psVar26) {
    (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
    super__Vector_impl_data._M_finish = psVar26;
  }
  local_88 = waveformMax;
  local_78 = waveformThreshold;
  local_70 = thresholdBackground;
  std::vector<short,_std::allocator<short>_>::resize(waveformThreshold,waveform->n);
  std::vector<short,_std::allocator<short>_>::resize(local_88,waveform->n);
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)(historySize * 8),(value_type_conflict5 *)&local_d8,
             (allocator_type *)&local_128);
  __n_00 = (size_type)historySize;
  std::deque<long,_std::allocator<long>_>::deque
            ((deque<long,_std::allocator<long>_> *)&local_d8,__n_00,(allocator_type *)&local_128);
  psVar3 = waveform->samples;
  __n = waveform->n;
  local_48 = waveform;
  std::vector<short,_std::allocator<short>_>::vector(&local_f0,__n,(allocator_type *)&local_128);
  if (0 < (long)__n) {
    sVar14 = 0;
    do {
      sVar2 = psVar3[sVar14];
      sVar18 = -sVar2;
      if (0 < sVar2) {
        sVar18 = sVar2;
      }
      local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar14] = sVar18;
      sVar14 = sVar14 + 1;
    } while (__n != sVar14);
  }
  local_138 = 0;
  local_7c = historySizeReset;
  if (0 < (long)__n) {
    local_68 = (long)(historySize / 2);
    local_38 = (long)(historySize * 2);
    local_40 = __n - local_38;
    local_130 = 0.0;
    iVar24 = 0;
    do {
      if (local_68 <= local_138) {
        lVar15 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        auVar28._8_4_ =
             (int)((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x23);
        auVar28._0_8_ = lVar15;
        auVar28._12_4_ = 0x45300000;
        iVar27 = (int)lVar15;
        dVar30 = (auVar28._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,iVar27) - 4503599627370496.0);
        dVar31 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar24];
        sVar2 = local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start[local_138];
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[iVar24] = (double)(int)sVar2;
        local_130 = ((local_130 * dVar30 - dVar31) + (double)(int)sVar2) / dVar30;
        iVar24 = iVar24 + 1;
        if (iVar27 <= iVar24) {
          iVar24 = 0;
        }
      }
      if (local_138 < (long)__n_00) {
        while (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          plVar16 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            plVar16 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          if (local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_start[local_138] <
              local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_start[plVar16[-1]]) break;
          if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_d8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        }
        if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                    ((deque<long,std::allocator<long>> *)&local_d8,&local_138);
        }
        else {
          *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_138;
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      else {
        while ((local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_d8._M_impl.super__Deque_impl_data._M_start._M_cur &&
               (*local_d8._M_impl.super__Deque_impl_data._M_start._M_cur <=
                (long)(local_138 - __n_00)))) {
          if (local_d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_d8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_d8._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
            local_d8._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_d8._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
        }
        while (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          plVar16 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            plVar16 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          if (local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_start[local_138] <
              local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_start[plVar16[-1]]) break;
          if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_d8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        }
        if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                    ((deque<long,std::allocator<long>> *)&local_d8,&local_138);
        }
        else {
          *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_138;
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        lVar15 = local_138 - local_68;
        if (((lVar15 < local_40 && local_38 <= lVar15) &&
            (*local_d8._M_impl.super__Deque_impl_data._M_start._M_cur == lVar15)) &&
           (local_130 * local_70 <
            (double)(int)local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar15])) {
          local_128.waveform.samples = local_48->samples;
          iVar10 = local_48->n;
          local_128.waveform.n._0_4_ = (undefined4)iVar10;
          local_128.waveform.n._4_4_ = (undefined4)((ulong)iVar10 >> 0x20);
          local_128.ccAvg._0_4_ = 0;
          local_128.ccAvg._4_4_ = 0;
          local_128.cid = -1;
          local_128.bind = -1;
          local_128.predicted = 0x3f;
          iVar4._M_current =
               (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_128.pos = lVar15;
          if (iVar4._M_current ==
              (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
            _M_realloc_insert<stKeyPressData<short>>
                      ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)res,
                       iVar4,&local_128);
          }
          else {
            (iVar4._M_current)->cid = -1;
            (iVar4._M_current)->bind = -1;
            *(ulong *)&(iVar4._M_current)->predicted = CONCAT44(local_128._44_4_,0x3f);
            (iVar4._M_current)->pos = lVar15;
            (iVar4._M_current)->ccAvg = 0.0;
            ((iVar4._M_current)->waveform).samples = local_128.waveform.samples;
            ((iVar4._M_current)->waveform).n = iVar10;
            ppsVar1 = &(res->
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                       .
                       super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppsVar1 = *ppsVar1 + 1;
          }
        }
        (local_78->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar15] = (short)(int)(local_130 * local_70);
        (local_88->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar15] =
             local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start
             [*local_d8._M_impl.super__Deque_impl_data._M_start._M_cur];
      }
      local_138 = local_138 + 1;
    } while (local_138 < (long)__n);
  }
  if (removeLowPower) {
    do {
      psVar26 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      psVar20 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      dVar31 = 0.0;
      for (psVar17 = psVar26; psVar20 != psVar17; psVar17 = psVar17 + 1) {
        dVar31 = dVar31 + (double)(int)local_f0.super__Vector_base<short,_std::allocator<short>_>.
                                       _M_impl.super__Vector_impl_data._M_start[psVar17->pos];
      }
      psVar17 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (psVar26 != psVar20) {
        lVar15 = ((long)psVar20 - (long)psVar26 >> 4) * -0x5555555555555555;
        auVar29._8_4_ = (int)((ulong)lVar15 >> 0x20);
        auVar29._0_8_ = lVar15;
        auVar29._12_4_ = 0x45300000;
        local_130 = (dVar31 / ((auVar29._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0))) *
                    0.3;
        psVar21 = psVar26;
        do {
          if (local_130 <
              (double)(int)local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_start[psVar21->pos]) {
            iVar4._M_current =
                 (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                 .super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
              _M_realloc_insert<stKeyPressData<short>const&>
                        ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)res,
                         iVar4,psVar21);
            }
            else {
              psVar3 = (psVar21->waveform).samples;
              iVar10 = (psVar21->waveform).n;
              TVar8 = psVar21->pos;
              TVar9 = psVar21->ccAvg;
              TVar11 = psVar21->bind;
              TVar12 = psVar21->predicted;
              uVar13 = *(undefined4 *)&psVar21->field_0x2c;
              (iVar4._M_current)->cid = psVar21->cid;
              (iVar4._M_current)->bind = TVar11;
              (iVar4._M_current)->predicted = TVar12;
              *(undefined4 *)&(iVar4._M_current)->field_0x2c = uVar13;
              (iVar4._M_current)->pos = TVar8;
              (iVar4._M_current)->ccAvg = TVar9;
              ((iVar4._M_current)->waveform).samples = psVar3;
              ((iVar4._M_current)->waveform).n = iVar10;
              ppsVar1 = &(res->
                         super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ).
                         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppsVar1 = *ppsVar1 + 1;
            }
          }
          psVar21 = psVar21 + 1;
        } while (psVar21 != psVar20);
      }
      psVar21 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      psVar5 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (psVar26 != (pointer)0x0) {
        operator_delete(psVar26,(long)psVar17 - (long)psVar26);
      }
    } while ((long)psVar21 - (long)psVar5 != (long)psVar20 - (long)psVar26);
  }
  psVar25 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(res->
                         super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ).
                         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar25 >> 4) *
                 -0x5555555555555555)) {
    local_128.pos._0_4_ = 0;
    local_128.pos._4_4_ = 0;
    local_128.ccAvg._0_4_ = 0;
    local_128.waveform.samples = (short *)0x0;
    local_128.waveform.n._0_4_ = 0;
    local_128.waveform.n._4_4_ = 0;
    std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
    _M_realloc_insert<stKeyPressData<short>const&>
              ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)&local_128,
               (iterator)0x0,psVar25);
    psVar26 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    psVar20 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (1 < (int)((ulong)((long)psVar20 - (long)psVar26) >> 4) * -0x55555555) {
      lVar23 = (long)local_7c;
      lVar22 = 1;
      lVar15 = 0x30;
      do {
        lVar6 = *(long *)((long)&psVar26->pos + lVar15);
        if ((lVar23 < lVar6 - ((stKeyPressData<short> *)(local_128.waveform.n + -0x30))->pos) ||
           (psVar7 = (local_88->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                     super__Vector_impl_data._M_start,
           psVar7[((stKeyPressData<short> *)(local_128.waveform.n + -0x30))->pos] < psVar7[lVar6]))
        {
          psVar25 = (stKeyPressData<short> *)((long)&(psVar26->waveform).samples + lVar15);
          if ((stKeyPressData<short> *)local_128.waveform.n ==
              (stKeyPressData<short> *)CONCAT44(local_128.pos._4_4_,(undefined4)local_128.pos)) {
            std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
            _M_realloc_insert<stKeyPressData<short>const&>
                      ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)
                       &local_128,(iterator)local_128.waveform.n,psVar25);
          }
          else {
            psVar3 = (psVar25->waveform).samples;
            iVar10 = (psVar25->waveform).n;
            TVar8 = psVar25->pos;
            TVar9 = psVar25->ccAvg;
            TVar11 = psVar25->bind;
            TVar12 = psVar25->predicted;
            uVar13 = *(undefined4 *)&psVar25->field_0x2c;
            ((stKeyPressData<short> *)local_128.waveform.n)->cid = psVar25->cid;
            ((stKeyPressData<short> *)local_128.waveform.n)->bind = TVar11;
            ((stKeyPressData<short> *)local_128.waveform.n)->predicted = TVar12;
            *(undefined4 *)&((stKeyPressData<short> *)local_128.waveform.n)->field_0x2c = uVar13;
            ((stKeyPressData<short> *)local_128.waveform.n)->pos = TVar8;
            ((stKeyPressData<short> *)local_128.waveform.n)->ccAvg = TVar9;
            (((stKeyPressData<short> *)local_128.waveform.n)->waveform).samples = psVar3;
            (((stKeyPressData<short> *)local_128.waveform.n)->waveform).n = iVar10;
            local_128.waveform.n = local_128.waveform.n + 0x30;
          }
        }
        lVar22 = lVar22 + 1;
        psVar26 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar20 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar15 = lVar15 + 0x30;
      } while (lVar22 < (int)((ulong)((long)psVar20 - (long)psVar26) >> 4) * -0x55555555);
    }
    psVar17 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar24 = res->nClusters;
    std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::_M_move_assign
              (&res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>,
               &local_128);
    psVar3 = local_128.waveform.samples;
    res->nClusters = local_128.ccAvg._0_4_;
    lVar15 = CONCAT44(local_128.pos._4_4_,(undefined4)local_128.pos);
    local_128.waveform.n._0_4_ = SUB84(psVar20,0);
    local_128.waveform.n._4_4_ = (undefined4)((ulong)psVar20 >> 0x20);
    local_128.pos._0_4_ = SUB84(psVar17,0);
    local_128.pos._4_4_ = (undefined4)((ulong)psVar17 >> 0x20);
    if (local_128.waveform.samples != (short *)0x0) {
      uVar19 = lVar15 - (long)local_128.waveform.samples;
      local_128.waveform.samples = (short *)psVar26;
      operator_delete(psVar3,uVar19);
      psVar26 = (pointer)local_128.waveform.samples;
    }
    local_128.waveform.samples = (short *)psVar26;
    local_128.ccAvg._0_4_ = iVar24;
    if ((pointer)local_128.waveform.samples != (pointer)0x0) {
      operator_delete(local_128.waveform.samples,
                      CONCAT44(local_128.pos._4_4_,(undefined4)local_128.pos) -
                      (long)local_128.waveform.samples);
    }
  }
  if (local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_d8);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool findKeyPresses(
        const TWaveformViewT<T> & waveform,
        TKeyPressCollectionT<T> & res,
        TWaveformT<T> & waveformThreshold,
        TWaveformT<T> & waveformMax,
        double thresholdBackground,
        int historySize,
        int historySizeReset,
        bool removeLowPower) {
    res.clear();
    waveformThreshold.resize(waveform.n);
    waveformMax.resize(waveform.n);

    int rbBegin = 0;
    double rbAverage = 0.0;
    std::vector<double> rbSamples(8*historySize, 0.0);

    int k = historySize;
    std::deque<int64_t> que(k);

    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<T> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i] = std::abs(samples[i]);
    }

    for (int64_t i = 0; i < n; ++i) {
        {
            int64_t ii = i - k/2;
            if (ii >= 0) {
                rbAverage *= rbSamples.size();
                rbAverage -= rbSamples[rbBegin];
                double acur = waveformAbs[i];
                rbSamples[rbBegin] = acur;
                rbAverage += acur;
                rbAverage /= rbSamples.size();
                if (++rbBegin >= (int) rbSamples.size()) {
                    rbBegin = 0;
                }
            }
        }

        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            if (itest >= 2*k && itest < n - 2*k && que.front() == itest) {
                double acur = waveformAbs[itest];
                if (acur > thresholdBackground*rbAverage) {
                    res.emplace_back(TKeyPressDataT<T> { std::move(waveform), itest, 0.0, -1, -1, '?' });
                }
            }
            waveformThreshold[itest] = thresholdBackground*rbAverage;
            waveformMax[itest] = waveformAbs[que.front()];
        }
    }

    if (removeLowPower) {
        while (true) {
            auto oldn = res.size();

            double avgPower = 0.0;
            for (const auto & kp : res) {
                avgPower += waveformAbs[kp.pos];
            }
            avgPower /= res.size();

            auto tmp = std::move(res);
            for (const auto & kp : tmp) {
                if (waveformAbs[kp.pos] > 0.3*avgPower) {
                    res.push_back(kp);
                }
            }

            if (res.size() == oldn) break;
        }
    }

    if (res.size() > 1) {
        TKeyPressCollectionT<T> res2;
        res2.push_back(res.front());

        for (int i = 1; i < (int) res.size(); ++i) {
            if (res[i].pos - res2.back().pos > historySizeReset || waveformMax[res[i].pos] > waveformMax[res2.back().pos]) {
                res2.push_back(res[i]);
            }
        }

        std::swap(res, res2);
    }

    return true;
}